

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O0

ktx_error_code_e
linearTilingPadCallback
          (int miplevel,int face,int width,int height,int depth,ktx_uint64_t faceLodSize,
          void *pixels,void *userdata)

{
  ktx_uint32_t kVar1;
  uint in_ECX;
  ktx_uint32_t in_ESI;
  undefined4 in_EDI;
  uint in_R8D;
  ulong in_R9;
  long in_stack_00000008;
  VkImageSubresource subRes;
  VkSubresourceLayout subResLayout;
  ktx_size_t copySize;
  ktx_uint8_t *pSrc;
  ktx_uint32_t image;
  ktx_uint32_t row;
  ktx_uint32_t imageIterations;
  ktx_uint32_t rowIterations;
  ktx_uint32_t srcRowPitch;
  VkDeviceSize imagePitch;
  ktx_size_t imageSize;
  VkDeviceSize offset;
  user_cbdata_linear *ud;
  undefined4 local_9c [2];
  ktxTexture *in_stack_ffffffffffffff70;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  void *local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  ulong local_40;
  ulong local_38;
  ktxTexture *local_30;
  
  local_38 = 0;
  local_40 = 0;
  local_9c[0] = 1;
  (**(code **)(subRes._4_8_ + 0xa8))
            (*(undefined8 *)(subRes._4_8_ + 0xf8),*(undefined8 *)(subRes._4_8_ + 0xf0),local_9c,
             &stack0xffffffffffffff70);
  kVar1 = ktxTexture_GetRowPitch(in_stack_ffffffffffffff70,in_ESI);
  local_48 = in_ECX;
  if (local_80 == kVar1) {
    local_48 = 1;
  }
  local_4c = 1;
  if ((1 < *(uint *)(*(long *)(subRes._4_8_ + 0x108) + 0x38)) ||
     (*(int *)(*(long *)(subRes._4_8_ + 0x108) + 0x30) == 3)) {
    local_38 = (**(code **)(*(long *)(*(long *)(subRes._4_8_ + 0x108) + 8) + 0x18))
                         (*(undefined8 *)(subRes._4_8_ + 0x108),in_EDI);
    if (*(uint *)(*(long *)(subRes._4_8_ + 0x108) + 0x38) < 2) {
      local_40 = local_70;
      if (local_70 != local_38) {
        local_4c = in_R8D;
      }
    }
    else {
      local_40 = local_78;
      if (local_78 != local_38) {
        local_4c = *(int *)(*(long *)(subRes._4_8_ + 0x108) + 0x38) *
                   *(int *)(*(long *)(subRes._4_8_ + 0x108) + 0x3c);
      }
    }
    if (local_40 < local_38) {
      __assert_fail("imageSize <= imagePitch",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                    ,0x2c5,
                    "ktx_error_code_e linearTilingPadCallback(int, int, int, int, int, ktx_uint64_t, void *, void *)"
                   );
    }
  }
  if (local_48 < 2) {
    local_68 = in_R9;
    if (1 < local_4c) {
      local_68 = in_R9 / local_4c;
    }
  }
  else if (local_80 < kVar1) {
    local_68 = local_80;
  }
  else {
    local_68 = (ulong)kVar1;
  }
  local_30 = in_stack_ffffffffffffff70;
  for (local_54 = 0; local_54 < local_4c; local_54 = local_54 + 1) {
    local_60 = (void *)(in_stack_00000008 + local_38 * local_54);
    for (local_50 = 0; local_50 < local_48; local_50 = local_50 + 1) {
      memcpy((void *)((long)&local_30->classId + *(long *)(subRes._4_8_ + 0x100)),local_60,local_68)
      ;
      local_30 = (ktxTexture *)((long)&local_30->classId + local_80);
      local_60 = (void *)((long)local_60 + (ulong)kVar1);
    }
    local_30 = (ktxTexture *)((long)&local_30->classId + local_40);
  }
  return KTX_SUCCESS;
}

Assistant:

KTX_error_code
linearTilingPadCallback(int miplevel, int face,
                      int width, int height, int depth,
                      ktx_uint64_t faceLodSize,
                      void* pixels, void* userdata)
{
    user_cbdata_linear* ud = (user_cbdata_linear*)userdata;
    VkDeviceSize offset;
    ktx_size_t   imageSize = 0;
    VkDeviceSize imagePitch = 0;
    ktx_uint32_t srcRowPitch;
    ktx_uint32_t rowIterations;
    ktx_uint32_t imageIterations;
    ktx_uint32_t row, image;
    ktx_uint8_t* pSrc;
    ktx_size_t   copySize;
    VkSubresourceLayout subResLayout;
#if !defined(_MSC_VER) || _MSC_VER >= 1920
    VkImageSubresource subRes = {
      .aspectMask = VK_IMAGE_ASPECT_COLOR_BIT,
      .mipLevel = miplevel,
      .arrayLayer = face
    };
#else
    VkImageSubresource subRes = {0};
    subRes.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
    subRes.mipLevel = miplevel;
    subRes.arrayLayer = face;
#endif

    UNUSED(width);

    // Get sub resources layout. Includes row pitch, size,
    // offsets, etc.
    ud->vkFuncs.vkGetImageSubresourceLayout(ud->device, ud->destImage, &subRes,
                                &subResLayout);

    srcRowPitch = ktxTexture_GetRowPitch(ud->texture, miplevel);

    if (subResLayout.rowPitch != srcRowPitch)
        rowIterations = height;
    else
        rowIterations = 1;

    imageIterations = 1;
    // Arrays, including cube map arrays, or 3D textures
    // Note from the Vulkan spec:
    //  *  arrayPitch is undefined for images that were not
    //     created as arrays.
    //  *  depthPitch is defined only for 3D images.
    if (ud->texture->numLayers > 1 || ud->texture->numDimensions == 3) {
        imageSize = ktxTexture_GetImageSize(ud->texture, miplevel);
        if (ud->texture->numLayers > 1) {
            imagePitch = subResLayout.arrayPitch;
            if (imagePitch != imageSize)
                imageIterations
                        = ud->texture->numLayers * ud->texture->numFaces;
        } else {
            imagePitch = subResLayout.depthPitch;
            if (imagePitch != imageSize)
                imageIterations = depth;
        }
        assert(imageSize <= imagePitch);
    }

    if (rowIterations > 1) {
        // Copy the minimum of srcRowPitch, the GL_UNPACK_ALIGNMENT padded size,
        // and subResLayout.rowPitch.
        if (subResLayout.rowPitch < srcRowPitch)
            copySize = subResLayout.rowPitch;
        else
            copySize = srcRowPitch;
    } else if (imageIterations > 1)
        copySize = faceLodSize / imageIterations;
    else
        copySize = faceLodSize;

    offset = subResLayout.offset;
    // Copy image data to destImage via its mapped memory.
    for (image = 0; image < imageIterations; image++) {
        pSrc = (ktx_uint8_t*)pixels + imageSize * image;
        for (row = 0; row < rowIterations; row++) {
            memcpy(ud->dest + offset, pSrc, copySize);
            offset += subResLayout.rowPitch;
            pSrc += srcRowPitch;
          }
        offset += imagePitch;
    }
    return KTX_SUCCESS;
}